

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QWellArray::setCurrent(QWellArray *this,int row,int col)

{
  int row_00;
  int column;
  int iVar1;
  bool bVar2;
  
  row_00 = this->curRow;
  column = this->curCol;
  if (column == col && row_00 == row) {
    return;
  }
  bVar2 = (col | row) < 0;
  if (bVar2) {
    col = -1;
  }
  iVar1 = -1;
  if (!bVar2) {
    iVar1 = row;
  }
  this->curRow = iVar1;
  this->curCol = col;
  updateCell(this,row_00,column);
  updateCell(this,this->curRow,this->curCol);
  currentChanged(this,this->curRow,this->curCol);
  return;
}

Assistant:

void QWellArray::setCurrent(int row, int col)
{
    if ((curRow == row) && (curCol == col))
        return;

    if (row < 0 || col < 0)
        row = col = -1;

    int oldRow = curRow;
    int oldCol = curCol;

    curRow = row;
    curCol = col;

    updateCell(oldRow, oldCol);
    updateCell(curRow, curCol);

    emit currentChanged(curRow, curCol);
}